

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<Function>::relocate
          (QArrayDataPointer<Function> *this,qsizetype offset,Function **data)

{
  Function *d_first;
  Function *pFVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<Function,long_long>(this->ptr,this->size,d_first);
  if (data != (Function **)0x0) {
    pFVar1 = *data;
    if ((this->ptr <= pFVar1) && (pFVar1 < this->ptr + this->size)) {
      *data = pFVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }